

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  pointer pFVar1;
  pointer pPVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  pointer pPVar6;
  pointer pFVar7;
  bool bVar8;
  
  pFVar7 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar3 = pFVar7 != pFVar1;
    if (!bVar3) {
      return bVar3;
    }
    pPVar6 = (pFVar7->m_patterns).
             super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (pFVar7->m_patterns).
             super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = pPVar6 == pPVar2;
    if (!bVar8) {
      iVar5 = (*(pPVar6->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
                _vptr_NonCopyable[4])(pPVar6->m_p,testCase);
      cVar4 = (char)iVar5;
      while (cVar4 != '\0') {
        pPVar6 = pPVar6 + 1;
        bVar8 = pPVar6 == pPVar2;
        if (bVar8) break;
        iVar5 = (*(pPVar6->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
                  _vptr_NonCopyable[4])(pPVar6->m_p,testCase);
        cVar4 = (char)iVar5;
      }
    }
    if (bVar8) {
      return bVar3;
    }
    pFVar7 = pFVar7 + 1;
  } while( true );
}

Assistant:

Equals( std::string const& str, CaseSensitive::Choice caseSensitivity = CaseSensitive::Yes )
            :   m_data( str, caseSensitivity )
            {}